

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O0

ktx_error_code_e
texImage2DCallback(int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
                  void *pixels,void *userdata)

{
  GLenum GVar1;
  GLsizei in_ECX;
  GLsizei in_EDX;
  int in_ESI;
  GLint in_EDI;
  void *in_stack_00000008;
  int *in_stack_00000010;
  ktx_cbdata *cbData;
  GLsizei local_4c;
  ktx_error_code_e local_c;
  
  local_4c = in_ECX;
  if (in_stack_00000010[5] != 0) {
    local_4c = in_stack_00000010[5];
  }
  (*gl.glTexImage2D)(*in_stack_00000010 + in_ESI,in_EDI,in_stack_00000010[2],in_EDX,local_4c,0,
                     in_stack_00000010[1],in_stack_00000010[3],in_stack_00000008);
  GVar1 = (*gl.glGetError)();
  in_stack_00000010[4] = GVar1;
  if (GVar1 == 0) {
    local_c = KTX_SUCCESS;
  }
  else {
    local_c = KTX_GL_ERROR;
  }
  return local_c;
}

Assistant:

KTX_error_code
texImage2DCallback(int miplevel, int face,
                   int width, int height,
                   int depth,
                   ktx_uint64_t faceLodSize,
                   void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(depth);
    UNUSED(faceLodSize);

    glTexImage2D(cbData->glTarget + face, miplevel,
                 cbData->glInternalformat, width,
                 cbData->numLayers == 0 ? (GLuint)height : cbData->numLayers, 0,
                 cbData->glFormat, cbData->glType, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}